

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ReadSchema(Parse *pParse)

{
  sqlite3_vfs *psVar1;
  sqlite3 *in_RDI;
  sqlite3 *db;
  int rc;
  uint in_stack_fffffffffffffff0;
  int iVar2;
  
  iVar2 = 0;
  psVar1 = in_RDI->pVfs;
  if (*(char *)((long)&psVar1[1].zName + 5) == '\0') {
    iVar2 = sqlite3Init(in_RDI,(char **)(ulong)in_stack_fffffffffffffff0);
    if (iVar2 == 0) {
      if (*(char *)((long)&psVar1->xRandomness + 7) != '\0') {
        *(uint *)((long)&psVar1->xOpen + 4) = *(uint *)((long)&psVar1->xOpen + 4) | 0x10;
      }
    }
    else {
      *(int *)&in_RDI->mutex = iVar2;
      *(int *)((long)&in_RDI->flags + 4) = *(int *)((long)&in_RDI->flags + 4) + 1;
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ReadSchema(Parse *pParse){
  int rc = SQLITE_OK;
  sqlite3 *db = pParse->db;
  assert( sqlite3_mutex_held(db->mutex) );
  if( !db->init.busy ){
    rc = sqlite3Init(db, &pParse->zErrMsg);
    if( rc!=SQLITE_OK ){
      pParse->rc = rc;
      pParse->nErr++;
    }else if( db->noSharedCache ){
      db->mDbFlags |= DBFLAG_SchemaKnownOk;
    }
  }
  return rc;
}